

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::ASTInterpreter::visitMessageSendNode(ASTInterpreter *this,MessageSendNode *node)

{
  pointer ppMVar1;
  pointer ppNVar2;
  InterpreterProxy *pIVar3;
  uint uVar4;
  Node *pNVar5;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *pvVar6;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar7;
  Oop OVar8;
  uint uVar9;
  Node **arg;
  pointer ppNVar10;
  MessageSendNode *this_00;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  
  pNVar5 = AST::MessageSendNode::getReceiver(node);
  (*pNVar5->_vptr_Node[2])(pNVar5,this);
  pvVar6 = AST::MessageSendNode::getChainedMessages(node);
  uVar9 = 0xffffffff;
  do {
    ppMVar1 = (pvVar6->
              super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (uint)((ulong)((long)(pvVar6->
                                 super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
    if ((int)uVar4 <= (int)uVar9) {
      return (Oop)&NilObject;
    }
    if ((int)uVar9 < 0) {
      this_00 = node;
      if (uVar9 != 0xffffffff) goto LAB_001437d2;
    }
    else {
      this_00 = ppMVar1[uVar9];
LAB_001437d2:
      (*this->interpreter->_vptr_InterpreterProxy[6])();
      uVar4 = (uint)((ulong)((long)(pvVar6->
                                   super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar6->
                                  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    uVar9 = uVar9 + 1;
    if (uVar9 != uVar4) {
      (*this->interpreter->_vptr_InterpreterProxy[8])();
    }
    pvVar7 = AST::MessageSendNode::getArguments(this_00);
    ppNVar2 = (pvVar7->
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar10 = (pvVar7->
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start; ppNVar10 != ppNVar2;
        ppNVar10 = ppNVar10 + 1) {
      (*(*ppNVar10)->_vptr_Node[2])(*ppNVar10,this);
    }
    pIVar3 = this->interpreter;
    OVar8 = AST::MessageSendNode::getSelectorOop(this_00);
    (*pIVar3->_vptr_InterpreterProxy[0x23])
              (pIVar3,OVar8.field_0,
               (ulong)((long)(pvVar7->
                             super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar7->
                            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3);
  } while( true );
}

Assistant:

Oop ASTInterpreter::visitMessageSendNode(MessageSendNode *node)
{
	// Evaluate the receiver.
	node->getReceiver()->acceptVisitor(this);
	auto &chained = node->getChainedMessages();

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];
        // Duplicate the receiver for the next chains
        if(i != -1)
            interpreter->popOop();
        if(i + 1 != (int)chained.size())
            interpreter->duplicateStackTop();

		// Evaluate the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
            arg->acceptVisitor(this);

        interpreter->sendMessageWithSelector(message->getSelectorOop(), (int)arguments.size());
	}

	return Oop();
}